

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

int __thiscall
FFlatVertexBuffer::CreateSectorVertices
          (FFlatVertexBuffer *this,sector_t *sec,secplane_t *plane,int floor)

{
  uint uVar1;
  int j;
  long lVar2;
  
  uVar1 = (this->vbo_shadowdata).Count;
  for (lVar2 = 0; lVar2 < sec->subsectorcount; lVar2 = lVar2 + 1) {
    CreateSubsectorVertices(this,sec->subsectors[lVar2],plane,floor);
  }
  return uVar1;
}

Assistant:

int FFlatVertexBuffer::CreateSectorVertices(sector_t *sec, const secplane_t &plane, int floor)
{
	int rt = vbo_shadowdata.Size();
	// First calculate the vertices for the sector itself
	for(int j=0; j<sec->subsectorcount; j++)
	{
		subsector_t *sub = sec->subsectors[j];
		CreateSubsectorVertices(sub, plane, floor);
	}
	return rt;
}